

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputSetDefaultTime(HelicsInput inp,HelicsTime val,HelicsError *err)

{
  InputObject *pIVar1;
  Time tval;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 != (InputObject *)0x0) {
    count_time<9,_long>::convert(val);
    helics::Input::setDefault_impl<TimeRepresentation<count_time<9,long>>const&>(pIVar1->inputPtr);
  }
  return;
}

Assistant:

void helicsInputSetDefaultTime(HelicsInput inp, HelicsTime val, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }

    const helics::Time tval(val);
    inpObj->inputPtr->setDefault(tval);
}